

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O1

int regexec(regex_t *__preg,char *__string,size_t __nmatch,regmatch_t *__pmatch,int __eflags)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  re_guts *prVar4;
  sopno stop;
  sop *psVar5;
  size_t __n;
  undefined8 uVar6;
  re_guts *prVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  regmatch_t rVar13;
  ushort **ppuVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  sop sVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  regmatch_t *__ptr;
  long lVar23;
  int iVar24;
  char *pcVar25;
  regmatch_t *__ptr_00;
  int iVar26;
  int iVar27;
  char *pcVar28;
  char *pcVar29;
  char *pcVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  uint local_108;
  lmat local_c8;
  size_t local_58;
  long local_50;
  char *local_48;
  regmatch_t *local_40;
  uint local_38;
  uint local_34;
  
  if (*(int *)&__preg->buffer != 0xf265) {
    return 2;
  }
  prVar4 = (re_guts *)__preg->syntax;
  if (prVar4->magic != 0xd245) {
    return 2;
  }
  if ((prVar4->iflags & 4) != 0) {
    return 2;
  }
  local_c8.g = prVar4;
  local_c8.offp = __string;
  local_40 = __pmatch;
  if (0x20 < (ulong)prVar4->nstates) {
    lVar32 = prVar4->firststate;
    lVar31 = prVar4->laststate;
    uVar20 = 0;
    if ((prVar4->cflags & 4) == 0) {
      uVar20 = __nmatch;
    }
    if ((__eflags & 4U) == 0) {
      rVar13 = (regmatch_t)strlen(__string);
      pcVar29 = __string;
    }
    else {
      pcVar29 = __string + (long)*__pmatch;
      rVar13 = __pmatch[1];
    }
    pcVar17 = __string + (long)rVar13;
    lVar22 = (long)pcVar17 - (long)pcVar29;
    if (pcVar17 < pcVar29) {
      return 0x10;
    }
    pcVar28 = prVar4->must;
    if (pcVar28 != (char *)0x0) {
      pcVar30 = pcVar29;
      if (pcVar29 < pcVar17) {
        cVar3 = *pcVar28;
        do {
          if (((*pcVar30 == cVar3) && (prVar4->mlen <= lVar22)) &&
             (iVar8 = bcmp(pcVar30,pcVar28,(long)prVar4->mlen), iVar8 == 0)) break;
          pcVar30 = pcVar30 + 1;
          lVar22 = lVar22 + -1;
        } while (pcVar30 < pcVar17);
      }
      if (pcVar30 == pcVar17) {
        return 1;
      }
    }
    local_c8.pmatch = (regmatch_t *)0x0;
    local_c8.lastpos = (char **)0x0;
    __n = prVar4->nstates;
    local_c8.eflags = __eflags & 7;
    local_c8.beginp = pcVar29;
    local_c8.endp = pcVar17;
    local_c8.space = (char *)malloc(__n * 4);
    if ((regmatch_t *)local_c8.space == (regmatch_t *)0x0) {
      return 0xc;
    }
    lVar32 = lVar32 + 1;
    local_c8.st._0_4_ = SUB84(local_c8.space,0);
    local_c8.st._4_4_ = (undefined4)((ulong)local_c8.space >> 0x20);
    local_c8.fresh = (char *)((long)&((regmatch_t *)local_c8.space)->rm_so + __n);
    local_c8.tmp = (char *)((long)&((regmatch_t *)local_c8.space)->rm_so + __n * 2);
    local_c8.vn = 4;
    local_c8.empty = (char *)((long)&((regmatch_t *)local_c8.space)->rm_so + __n * 3);
    memset(local_c8.empty,0,__n);
LAB_001078ca:
    pcVar28 = local_c8.fresh;
    if (local_c8.beginp == pcVar29) {
      iVar8 = 0x80;
    }
    else {
      iVar8 = (int)pcVar29[-1];
    }
    pcVar30 = (char *)CONCAT44(local_c8.st._4_4_,local_c8.st._0_4_);
    local_48 = local_c8.tmp;
    memset(pcVar30,0,(local_c8.g)->nstates);
    pcVar30[lVar32] = '\x01';
    lstep(local_c8.g,lVar32,lVar31,pcVar30,0x84,pcVar30);
    memcpy(pcVar28,pcVar30,(local_c8.g)->nstates);
    pcVar25 = (char *)0x0;
    do {
      prVar7 = local_c8.g;
      if (pcVar29 == local_c8.endp) {
        iVar12 = 0x80;
      }
      else {
        iVar12 = (int)*pcVar29;
      }
      iVar24 = bcmp(pcVar30,pcVar28,(local_c8.g)->nstates);
      if (iVar24 == 0) {
        pcVar25 = pcVar29;
      }
      iVar24 = 0;
      iVar10 = 0x82;
      if (iVar8 == 0x80) {
        iVar27 = 0;
        if ((local_c8.eflags & 1U) == 0) goto LAB_001079be;
      }
      else if ((iVar8 == 10) && ((prVar7->cflags & 8) != 0)) {
LAB_001079be:
        iVar27 = prVar7->nbol;
        iVar24 = 0x81;
        iVar10 = 0x83;
      }
      else {
        iVar27 = 0;
      }
      if (iVar12 == 0x80) {
        if ((local_c8.eflags & 2U) == 0) goto LAB_001079f8;
      }
      else if ((iVar12 == 10) && ((prVar7->cflags & 8) != 0)) {
LAB_001079f8:
        iVar27 = iVar27 + prVar7->neol;
        iVar24 = iVar10;
      }
      if (0 < iVar27) {
        iVar27 = iVar27 + 1;
        do {
          lstep(local_c8.g,lVar32,lVar31,pcVar30,iVar24,pcVar30);
          iVar27 = iVar27 + -1;
        } while (1 < iVar27);
      }
      if (iVar24 == 0x81) {
        iVar10 = 0x81;
joined_r0x00107a70:
        if (iVar12 != 0x80) {
          ppuVar14 = __ctype_b_loc();
          if (iVar12 == 0x5f) {
            iVar24 = 0x85;
          }
          iVar10 = iVar24;
          if (((*ppuVar14)[iVar12] & 8) != 0) {
            iVar10 = 0x85;
          }
        }
      }
      else {
        iVar10 = iVar24;
        if (((iVar8 != 0x80) && (ppuVar14 = __ctype_b_loc(), ((*ppuVar14)[iVar8] & 8) == 0)) &&
           (iVar8 != 0x5f)) goto joined_r0x00107a70;
      }
      if (iVar8 != 0x80) {
        ppuVar14 = __ctype_b_loc();
        if (((((*ppuVar14)[iVar8] & 8) != 0) || (iVar8 == 0x5f)) &&
           ((iVar10 == 0x82 ||
            (((iVar12 != 0x80 && (((*ppuVar14)[iVar12] & 8) == 0)) && (iVar12 != 0x5f)))))) {
          iVar10 = 0x86;
        }
      }
      if (iVar10 - 0x85U < 2) {
        lstep(local_c8.g,lVar32,lVar31,pcVar30,iVar10,pcVar30);
      }
      pcVar15 = local_48;
      if ((pcVar29 == pcVar17) || (pcVar30[lVar31] != '\0')) goto LAB_00107b8b;
      memcpy(local_48,pcVar30,(local_c8.g)->nstates);
      memcpy(pcVar30,pcVar28,(local_c8.g)->nstates);
      lstep(local_c8.g,lVar32,lVar31,pcVar15,iVar12,pcVar30);
      pcVar29 = pcVar29 + 1;
      iVar8 = iVar12;
    } while( true );
  }
  lVar32 = prVar4->firststate;
  stop = prVar4->laststate;
  local_58 = 0;
  if ((prVar4->cflags & 4) == 0) {
    local_58 = __nmatch;
  }
  if ((__eflags & 4U) == 0) {
    rVar13 = (regmatch_t)strlen(__string);
    pcVar29 = __string;
  }
  else {
    pcVar29 = __string + (long)*__pmatch;
    rVar13 = __pmatch[1];
  }
  local_48 = __string + (long)rVar13;
  lVar31 = (long)local_48 - (long)pcVar29;
  if (local_48 < pcVar29) {
    return 0x10;
  }
  local_108 = __eflags & 7;
  pcVar17 = prVar4->must;
  if (pcVar17 != (char *)0x0) {
    pcVar28 = pcVar29;
    if (pcVar29 < local_48) {
      cVar3 = *pcVar17;
      do {
        if ((*pcVar28 == cVar3) && (prVar4->mlen <= lVar31)) {
          iVar8 = bcmp(pcVar28,pcVar17,(long)prVar4->mlen);
          if (iVar8 == 0) break;
        }
        pcVar28 = pcVar28 + 1;
        lVar31 = lVar31 + -1;
      } while (pcVar28 < local_48);
    }
    if (pcVar28 == local_48) {
      return 1;
    }
  }
  lVar32 = lVar32 + 1;
  local_c8.eflags = local_108;
  local_c8.pmatch = (regmatch_t *)0x0;
  local_c8.lastpos = (char **)0x0;
  local_38 = 1 << ((byte)lVar32 & 0x1f);
  local_50 = CONCAT44(local_50._4_4_,1 << ((byte)stop & 0x1f));
  local_c8._68_4_ = 0;
  local_c8.space = (char *)0x0;
  local_c8.st._0_4_ = 0;
  local_c8.beginp = pcVar29;
  local_c8.endp = local_48;
LAB_00107046:
  prVar7 = local_c8.g;
  if (local_c8.beginp == pcVar29) {
    iVar8 = 0x80;
  }
  else {
    iVar8 = (int)pcVar29[-1];
  }
  uVar9 = sstep(local_c8.g,lVar32,stop,local_38,0x84,local_38);
  pcVar28 = local_c8.endp;
  iVar12 = local_c8.eflags;
  pcVar17 = (char *)0x0;
  uVar11 = uVar9;
  local_34 = uVar9;
  do {
    if (pcVar29 == pcVar28) {
      iVar24 = 0x80;
    }
    else {
      iVar24 = (int)*pcVar29;
    }
    if (uVar11 == uVar9) {
      pcVar17 = pcVar29;
    }
    iVar10 = 0;
    iVar27 = 0x82;
    if (iVar8 == 0x80) {
      iVar26 = 0;
      if ((iVar12 & 1U) == 0) {
LAB_0010710c:
        iVar26 = prVar7->nbol;
        iVar27 = 0x83;
        iVar10 = 0x81;
      }
    }
    else if (iVar8 == 10) {
      if ((prVar7->cflags & 8) != 0) goto LAB_0010710c;
      iVar26 = 0;
      iVar10 = 0;
    }
    else {
      iVar26 = 0;
      iVar10 = 0;
    }
    if (iVar24 == 0x80) {
      if ((iVar12 & 2U) == 0) goto LAB_00107158;
    }
    else if ((iVar24 == 10) && ((prVar7->cflags & 8) != 0)) {
LAB_00107158:
      iVar26 = iVar26 + prVar7->neol;
      iVar10 = iVar27;
    }
    if (0 < iVar26) {
      iVar26 = iVar26 + 1;
      do {
        uVar11 = sstep(prVar7,lVar32,stop,uVar11,iVar10,uVar11);
        iVar26 = iVar26 + -1;
      } while (1 < iVar26);
    }
    if (iVar10 == 0x81) {
      iVar27 = 0x81;
joined_r0x001071e3:
      if (iVar24 != 0x80) {
        ppuVar14 = __ctype_b_loc();
        if (iVar24 == 0x5f) {
          iVar10 = 0x85;
        }
        iVar27 = iVar10;
        if (((*ppuVar14)[iVar24] & 8) != 0) {
          iVar27 = 0x85;
        }
      }
    }
    else {
      iVar27 = iVar10;
      if (((iVar8 != 0x80) && (ppuVar14 = __ctype_b_loc(), ((*ppuVar14)[iVar8] & 8) == 0)) &&
         (iVar8 != 0x5f)) goto joined_r0x001071e3;
    }
    if (iVar8 != 0x80) {
      ppuVar14 = __ctype_b_loc();
      if (((((*ppuVar14)[iVar8] & 8) != 0) || (iVar8 == 0x5f)) &&
         ((iVar27 == 0x82 ||
          (((iVar24 != 0x80 && (((*ppuVar14)[iVar24] & 8) == 0)) && (iVar24 != 0x5f)))))) {
        iVar27 = 0x86;
      }
    }
    if (iVar27 - 0x85U < 2) {
      uVar11 = sstep(prVar7,lVar32,stop,uVar11,iVar27,uVar11);
    }
    uVar9 = local_34;
    pcVar30 = local_48;
    if ((pcVar29 == local_48) || ((uVar11 & (uint)local_50) != 0)) goto LAB_001072de;
    uVar11 = sstep(prVar7,lVar32,stop,uVar11,iVar24,local_34);
    pcVar29 = pcVar29 + 1;
    iVar8 = iVar24;
  } while( true );
LAB_00107b8b:
  local_c8.coldp = pcVar25;
  if (pcVar30[lVar31] == '\0') {
    iVar8 = 1;
    __ptr_00 = (regmatch_t *)local_c8.space;
    goto LAB_0010819e;
  }
  if ((uVar20 != 0) || (prVar4->backrefs != 0)) {
    while (local_c8.coldp = pcVar25, pcVar29 = lslow(&local_c8,pcVar25,pcVar17,lVar32,lVar31),
          pcVar29 == (char *)0x0) {
      pcVar25 = local_c8.coldp + 1;
    }
    if ((uVar20 == 1) && (prVar4->backrefs == 0)) goto LAB_00108109;
    if (local_c8.pmatch == (regmatch_t *)0x0) {
      local_c8.pmatch = (regmatch_t *)malloc((local_c8.g)->nsub * 0x10 + 0x10);
    }
    __ptr = local_c8.pmatch;
    if (local_c8.pmatch == (regmatch_t *)0x0) {
      iVar8 = 0xc;
      __ptr_00 = (regmatch_t *)local_c8.space;
      goto LAB_0010819e;
    }
    if ((local_c8.g)->nsub != 0) {
      memset(local_c8.pmatch + 1,0xff,(local_c8.g)->nsub << 4);
    }
    if ((prVar4->backrefs == 0) && ((local_c8.eflags & 0x400U) == 0)) {
      lVar22 = lVar32;
      pcVar30 = local_c8.coldp;
      pcVar28 = local_c8.coldp;
      lVar23 = lVar31;
      if (lVar32 < lVar31) {
        do {
          local_50 = lVar23;
          sVar18 = (local_c8.g)->strip[lVar22];
          uVar9 = (uint)sVar18;
          uVar11 = uVar9 & 0x7c000000;
          if (((ulong)uVar11 == 0x24000000) || (uVar11 == 0x2c000000)) {
            lVar23 = (ulong)(uVar9 & 0x3ffffff) + lVar22;
          }
          else {
            lVar23 = lVar22;
            if (uVar11 == 0x3c000000) {
              do {
                lVar23 = lVar23 + (ulong)((uint)sVar18 & 0x3ffffff);
                sVar18 = (local_c8.g)->strip[lVar23];
              } while (((uint)sVar18 & 0x7c000000) != 0x48000000);
            }
          }
          lVar16 = lVar23 + 1;
          pcVar28 = pcVar30;
          switch((ulong)uVar11 - 0x4000000 >> 0x1a) {
          case 1:
          case 4:
          case 5:
            pcVar28 = pcVar30 + 1;
            break;
          case 8:
            pcVar25 = pcVar29;
            do {
              pcVar28 = lslow(&local_c8,pcVar30,pcVar25,lVar22,lVar16);
              pcVar15 = lslow(&local_c8,pcVar28,pcVar29,lVar16,lVar31);
              pcVar25 = pcVar28 + -1;
            } while (pcVar15 != pcVar29);
            do {
              pcVar25 = lslow(&local_c8,pcVar30,pcVar28,lVar22 + 1,lVar23);
              lVar31 = local_50;
              if (pcVar25 == (char *)0x0) break;
              bVar33 = pcVar25 != pcVar30;
              pcVar30 = pcVar25;
            } while (bVar33);
            break;
          case 10:
            pcVar25 = pcVar29;
            do {
              pcVar28 = lslow(&local_c8,pcVar30,pcVar25,lVar22,lVar16);
              pcVar15 = lslow(&local_c8,pcVar28,pcVar29,lVar16,lVar31);
              pcVar25 = pcVar28 + -1;
            } while (pcVar15 != pcVar29);
            lslow(&local_c8,pcVar30,pcVar28,lVar22 + 1,lVar23);
            break;
          case 0xc:
            *(long *)((long)&(local_c8.pmatch)->rm_so + (ulong)((uVar9 & 0x3ffffff) << 4)) =
                 (long)pcVar30 - (long)local_c8.offp;
            break;
          case 0xd:
            *(long *)((long)&(local_c8.pmatch)->rm_eo + (ulong)((uVar9 & 0x3ffffff) << 4)) =
                 (long)pcVar30 - (long)local_c8.offp;
            break;
          case 0xe:
            pcVar25 = pcVar29;
            do {
              pcVar28 = lslow(&local_c8,pcVar30,pcVar25,lVar22,lVar16);
              pcVar15 = lslow(&local_c8,pcVar28,pcVar29,lVar16,lVar31);
              pcVar25 = pcVar28 + -1;
            } while (pcVar15 != pcVar29);
            lVar23 = lVar22 + (ulong)((uint)(local_c8.g)->strip[lVar22] & 0x3ffffff) + -1;
            pcVar25 = lslow(&local_c8,pcVar30,pcVar28,lVar22 + 1,lVar23);
            if (pcVar25 != pcVar28) {
              do {
                uVar21 = (ulong)((uint)(local_c8.g)->strip[lVar23 + 1] & 0x3ffffff);
                lVar19 = lVar23 + uVar21 + 1;
                lVar22 = uVar21 + lVar23;
                if ((*(uint *)((local_c8.g)->strip + lVar19) & 0x7c000000) != 0x44000000) {
                  lVar22 = lVar19;
                }
                pcVar25 = lslow(&local_c8,pcVar30,pcVar28,lVar23 + 2,lVar22);
                lVar23 = lVar22;
              } while (pcVar25 != pcVar28);
            }
          }
          lVar22 = lVar16;
          pcVar30 = pcVar28;
          lVar23 = local_50;
        } while (lVar16 < lVar31);
      }
    }
    else {
      lVar22 = prVar4->nplus;
      if ((0 < lVar22) && ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0)) {
        local_c8.lastpos = (char **)malloc(lVar22 * 8 + 8);
      }
      if ((0 < lVar22) && ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0)) {
        iVar8 = 0xc;
        goto LAB_0010818e;
      }
      pcVar28 = lbackref(&local_c8,local_c8.coldp,pcVar29,lVar32,lVar31,0);
    }
    if (pcVar28 != (char *)0x0) goto LAB_00108109;
    bVar33 = true;
    do {
      if (pcVar29 <= local_c8.coldp) break;
      pcVar29 = lslow(&local_c8,local_c8.coldp,pcVar29 + -1,lVar32,lVar31);
      if (pcVar29 == (char *)0x0) {
        pcVar29 = (char *)0x0;
        break;
      }
      pcVar28 = lbackref(&local_c8,local_c8.coldp,pcVar29,lVar32,lVar31,0);
      bVar33 = pcVar28 == (char *)0x0;
    } while (bVar33);
    if (!bVar33) goto LAB_00108109;
    pcVar29 = local_c8.coldp + 1;
    goto LAB_001078ca;
  }
  pcVar29 = pcVar29 + 1;
LAB_00108109:
  if (uVar20 != 0) {
    *local_40 = (regmatch_t)((long)local_c8.coldp - (long)local_c8.offp);
    local_40[1] = (regmatch_t)((long)pcVar29 - (long)local_c8.offp);
  }
  if (1 < uVar20) {
    uVar21 = 1;
    lVar32 = 0x10;
    do {
      puVar1 = (undefined8 *)((long)&local_40->rm_so + lVar32);
      if ((local_c8.g)->nsub < uVar21) {
        *(undefined4 *)puVar1 = 0xffffffff;
        *(undefined4 *)((long)puVar1 + 4) = 0xffffffff;
        *(undefined4 *)(puVar1 + 1) = 0xffffffff;
        *(undefined4 *)((long)puVar1 + 0xc) = 0xffffffff;
      }
      else {
        puVar2 = (undefined8 *)((long)&(local_c8.pmatch)->rm_so + lVar32);
        uVar6 = puVar2[1];
        *puVar1 = *puVar2;
        puVar1[1] = uVar6;
      }
      uVar21 = uVar21 + 1;
      lVar32 = lVar32 + 0x10;
    } while (uVar20 != uVar21);
  }
  if (local_c8.pmatch != (regmatch_t *)0x0) {
    free(local_c8.pmatch);
  }
  iVar8 = 0;
  __ptr = (regmatch_t *)local_c8.lastpos;
  __ptr_00 = (regmatch_t *)local_c8.space;
  if ((regmatch_t *)local_c8.lastpos != (regmatch_t *)0x0) {
LAB_0010818e:
    free(__ptr);
    __ptr_00 = (regmatch_t *)local_c8.space;
  }
  goto LAB_0010819e;
LAB_001072de:
  if (((uint)local_50 & uVar11) == 0) {
    return 1;
  }
  local_c8.coldp = pcVar17;
  if ((local_58 != 0) || (prVar4->backrefs != 0)) {
    pcVar29 = sslow((smat *)&local_c8,pcVar17,local_48,lVar32,stop);
    while (pcVar29 == (char *)0x0) {
      pcVar17 = pcVar17 + 1;
      local_c8.coldp = pcVar17;
      pcVar29 = sslow((smat *)&local_c8,pcVar17,pcVar30,lVar32,stop);
    }
    if ((local_58 == 1) && (prVar4->backrefs == 0)) goto LAB_0010806d;
    if (local_c8.pmatch == (regmatch_t *)0x0) {
      local_c8.pmatch = (regmatch_t *)malloc(prVar7->nsub * 0x10 + 0x10);
    }
    __ptr_00 = local_c8.pmatch;
    if (local_c8.pmatch == (regmatch_t *)0x0) {
      return 0xc;
    }
    if (prVar7->nsub != 0) {
      memset(local_c8.pmatch + 1,0xff,prVar7->nsub << 4);
    }
    pcVar28 = local_c8.offp;
    if ((iVar12 & 0x400U) == 0 && prVar4->backrefs == 0) {
      if (lVar32 < stop) {
        psVar5 = prVar7->strip;
        pcVar30 = pcVar17;
        lVar31 = lVar32;
        do {
          sVar18 = psVar5[lVar31];
          uVar11 = (uint)sVar18;
          uVar9 = uVar11 & 0x7c000000;
          if (((ulong)uVar9 == 0x24000000) || (uVar9 == 0x2c000000)) {
            lVar22 = (ulong)(uVar11 & 0x3ffffff) + lVar31;
          }
          else {
            lVar22 = lVar31;
            if (uVar9 == 0x3c000000) {
              do {
                lVar22 = lVar22 + (ulong)((uint)sVar18 & 0x3ffffff);
                sVar18 = psVar5[lVar22];
              } while (((uint)sVar18 & 0x7c000000) != 0x48000000);
            }
          }
          lVar23 = lVar22 + 1;
          pcVar17 = pcVar30;
          switch((ulong)uVar9 - 0x4000000 >> 0x1a) {
          case 1:
          case 4:
          case 5:
            pcVar17 = pcVar30 + 1;
            break;
          default:
            break;
          case 8:
            pcVar25 = pcVar29;
            do {
              pcVar17 = sslow((smat *)&local_c8,pcVar30,pcVar25,lVar31,lVar23);
              pcVar15 = sslow((smat *)&local_c8,pcVar17,pcVar29,lVar23,stop);
              pcVar25 = pcVar17 + -1;
            } while (pcVar15 != pcVar29);
            do {
              pcVar25 = sslow((smat *)&local_c8,pcVar30,pcVar17,lVar31 + 1,lVar22);
              if (pcVar25 == (char *)0x0) break;
              bVar33 = pcVar25 != pcVar30;
              pcVar30 = pcVar25;
            } while (bVar33);
            break;
          case 10:
            pcVar25 = pcVar29;
            do {
              pcVar17 = sslow((smat *)&local_c8,pcVar30,pcVar25,lVar31,lVar23);
              pcVar15 = sslow((smat *)&local_c8,pcVar17,pcVar29,lVar23,stop);
              pcVar25 = pcVar17 + -1;
            } while (pcVar15 != pcVar29);
            sslow((smat *)&local_c8,pcVar30,pcVar17,lVar31 + 1,lVar22);
            break;
          case 0xc:
            *(long *)((long)&__ptr_00->rm_so + (ulong)((uVar11 & 0x3ffffff) << 4)) =
                 (long)pcVar30 - (long)pcVar28;
            break;
          case 0xd:
            *(long *)((long)&__ptr_00->rm_eo + (ulong)((uVar11 & 0x3ffffff) << 4)) =
                 (long)pcVar30 - (long)pcVar28;
            break;
          case 0xe:
            pcVar25 = pcVar29;
            do {
              pcVar17 = sslow((smat *)&local_c8,pcVar30,pcVar25,lVar31,lVar23);
              pcVar15 = sslow((smat *)&local_c8,pcVar17,pcVar29,lVar23,stop);
              pcVar25 = pcVar17 + -1;
            } while (pcVar15 != pcVar29);
            lVar22 = (ulong)(uVar11 & 0x3ffffff) + lVar31 + -1;
            pcVar25 = sslow((smat *)&local_c8,pcVar30,pcVar17,lVar31 + 1,lVar22);
            while (pcVar25 != pcVar17) {
              uVar20 = (ulong)((uint)psVar5[lVar22 + 1] & 0x3ffffff);
              lVar16 = lVar22 + 1 + uVar20;
              lVar31 = uVar20 + lVar22;
              if ((*(uint *)(psVar5 + lVar16) & 0x7c000000) != 0x44000000) {
                lVar31 = lVar16;
              }
              pcVar25 = sslow((smat *)&local_c8,pcVar30,pcVar17,lVar22 + 2,lVar31);
              lVar22 = lVar31;
            }
          }
          pcVar30 = pcVar17;
          lVar31 = lVar23;
        } while (lVar23 < stop);
      }
    }
    else {
      lVar31 = prVar4->nplus;
      if ((0 < lVar31) && ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0)) {
        local_c8.lastpos = (char **)malloc(lVar31 * 8 + 8);
      }
      if ((0 < lVar31) && ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0)) {
        iVar8 = 0xc;
        goto LAB_0010819e;
      }
      pcVar17 = sbackref((smat *)&local_c8,pcVar17,pcVar29,lVar32,stop,0);
    }
    if (pcVar17 != (char *)0x0) goto LAB_0010806d;
    bVar33 = true;
    if (local_c8.coldp < pcVar29) {
      while (pcVar17 = local_c8.coldp,
            pcVar29 = sslow((smat *)&local_c8,local_c8.coldp,pcVar29 + -1,lVar32,stop),
            pcVar29 != (char *)0x0) {
        pcVar17 = sbackref((smat *)&local_c8,pcVar17,pcVar29,lVar32,stop,0);
        bVar33 = pcVar17 == (char *)0x0;
        if ((!bVar33) || (pcVar29 <= local_c8.coldp)) goto LAB_00107787;
      }
      pcVar29 = (char *)0x0;
    }
LAB_00107787:
    if (!bVar33) goto LAB_0010806d;
    pcVar29 = local_c8.coldp + 1;
    goto LAB_00107046;
  }
  pcVar29 = pcVar29 + 1;
LAB_0010806d:
  if (local_58 != 0) {
    *local_40 = (regmatch_t)((long)local_c8.coldp - (long)local_c8.offp);
    local_40[1] = (regmatch_t)((long)pcVar29 - (long)local_c8.offp);
  }
  if (1 < local_58) {
    uVar20 = 1;
    lVar32 = 0x10;
    do {
      puVar1 = (undefined8 *)((long)&local_40->rm_so + lVar32);
      if ((local_c8.g)->nsub < uVar20) {
        *(undefined4 *)puVar1 = 0xffffffff;
        *(undefined4 *)((long)puVar1 + 4) = 0xffffffff;
        *(undefined4 *)(puVar1 + 1) = 0xffffffff;
        *(undefined4 *)((long)puVar1 + 0xc) = 0xffffffff;
      }
      else {
        puVar2 = (undefined8 *)((long)&(local_c8.pmatch)->rm_so + lVar32);
        uVar6 = puVar2[1];
        *puVar1 = *puVar2;
        puVar1[1] = uVar6;
      }
      uVar20 = uVar20 + 1;
      lVar32 = lVar32 + 0x10;
    } while (local_58 != uVar20);
  }
  if (local_c8.pmatch != (regmatch_t *)0x0) {
    free(local_c8.pmatch);
  }
  iVar8 = 0;
  __ptr_00 = (regmatch_t *)local_c8.lastpos;
  if ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0) {
    return 0;
  }
LAB_0010819e:
  free(__ptr_00);
  return iVar8;
}

Assistant:

int				/* 0 success, REG_NOMATCH failure */
regexec(preg, string, nmatch, pmatch, eflags)
const regex_t *preg;
const char *string;
size_t nmatch;
regmatch_t pmatch[];
int eflags;
{
	register struct re_guts *g = preg->re_g;
#ifdef REDEBUG
#	define	GOODFLAGS(f)	(f)
#else
#	define	GOODFLAGS(f)	((f)&(REG_NOTBOL|REG_NOTEOL|REG_STARTEND))
#endif

	if (preg->re_magic != MAGIC1 || g->magic != MAGIC2)
		return(REG_BADPAT);
	assert(!(g->iflags&BAD));
	if (g->iflags&BAD)		/* backstop for no-debug case */
		return(REG_BADPAT);
	eflags = GOODFLAGS(eflags);

	if (g->nstates <= CHAR_BIT*sizeof(states1) && !(eflags&REG_LARGE))
		return(smatcher(g, (char *)string, nmatch, pmatch, eflags));
	else
		return(lmatcher(g, (char *)string, nmatch, pmatch, eflags));
}